

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# databaseinfo.cpp
# Opt level: O1

void __thiscall DatabaseInfo::acceptWidget(DatabaseInfo *this,DomWidget *node)

{
  QArrayData *pQVar1;
  long lVar2;
  DomStringList *pDVar3;
  QString *args;
  qsizetype qVar4;
  int iVar5;
  Node<QString,_DomProperty_*> *pNVar6;
  DomProperty **ppDVar7;
  DomProperty *pDVar8;
  QList<QString> *pQVar9;
  long lVar10;
  long in_FS_OFFSET;
  bool bVar11;
  QLatin1String QVar12;
  DomProperty *p;
  QHash<QString,_DomProperty_*> properties;
  QString local_b8;
  QString local_98;
  QArrayDataPointer<QString> local_78;
  QHash<QString,_DomProperty_*> local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &((node->m_property).d.d)->super_QArrayData;
  ppDVar7 = (node->m_property).d.ptr;
  lVar2 = (node->m_property).d.size;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_58.d = (Data<QHashPrivate::Node<QString,_DomProperty_*>_> *)0x0;
  if (lVar2 != 0) {
    lVar10 = 0;
    do {
      local_78.d = *(Data **)((long)ppDVar7 + lVar10);
      local_50.d.d = *(Data **)&(local_78.d)->super_QArrayData;
      local_50.d.ptr = (char16_t *)((local_78.d)->super_QArrayData).alloc;
      local_50.d.size._0_4_ = local_78.d[1].super_QArrayData.ref_;
      local_50.d.size._4_4_ = local_78.d[1].super_QArrayData.flags;
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QHash<QString,DomProperty*>::emplace<DomProperty*const&>
                ((QHash<QString,DomProperty*> *)&local_58,&local_50,(DomProperty **)&local_78);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar10 = lVar10 + 8;
    } while (lVar2 << 3 != lVar10);
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,8,0x10);
    }
  }
  local_50.d.d = (Data *)&DAT_0000000d;
  local_50.d.ptr = L"frameworkCode";
  if (local_58.d == (Data<QHashPrivate::Node<QString,_DomProperty_*>_> *)0x0) {
LAB_00140dfa:
    ppDVar7 = (DomProperty **)0x0;
  }
  else {
    pNVar6 = QHashPrivate::Data<QHashPrivate::Node<QString,_DomProperty_*>_>::
             findNode<QLatin1String>(local_58.d,(QLatin1String *)&local_50);
    if (pNVar6 == (Node<QString,_DomProperty_*> *)0x0) goto LAB_00140dfa;
    ppDVar7 = &pNVar6->value;
  }
  if (ppDVar7 == (DomProperty **)0x0) {
    pDVar8 = (DomProperty *)0x0;
  }
  else {
    pDVar8 = *ppDVar7;
  }
  if (pDVar8 == (DomProperty *)0x0) {
    bVar11 = false;
  }
  else {
    local_50.d.d = (pDVar8->m_bool).d.d;
    local_50.d.ptr = (pDVar8->m_bool).d.ptr;
    local_50.d.size = (pDVar8->m_bool).d.size;
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_50.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_50.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar12.m_data = &DAT_00000004;
    QVar12.m_size = (qsizetype)&local_50;
    iVar5 = QString::compare(QVar12,0x179494);
    bVar11 = iVar5 != 0;
  }
  if ((pDVar8 != (DomProperty *)0x0) && (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar11) goto LAB_00141125;
  local_78.d = (Data *)&DAT_00000008;
  local_78.ptr = (QString *)0x179904;
  if (local_58.d == (Data<QHashPrivate::Node<QString,_DomProperty_*>_> *)0x0) {
LAB_00140ecc:
    ppDVar7 = (DomProperty **)0x0;
  }
  else {
    pNVar6 = QHashPrivate::Data<QHashPrivate::Node<QString,_DomProperty_*>_>::
             findNode<QLatin1String>(local_58.d,(QLatin1String *)&local_78);
    if (pNVar6 == (Node<QString,_DomProperty_*> *)0x0) goto LAB_00140ecc;
    ppDVar7 = &pNVar6->value;
  }
  if (ppDVar7 == (DomProperty **)0x0) {
    pDVar8 = (DomProperty *)0x0;
  }
  else {
    pDVar8 = *ppDVar7;
  }
  if ((pDVar8 == (DomProperty *)0x0) ||
     (pDVar3 = pDVar8->m_stringList, pDVar3 == (DomStringList *)0x0)) {
LAB_00141116:
    TreeWalker::acceptWidget(&this->super_TreeWalker,node);
  }
  else {
    local_78.d = (pDVar3->m_string).d.d;
    args = (pDVar3->m_string).d.ptr;
    local_78.size = (pDVar3->m_string).d.size;
    if (local_78.d != (Data *)0x0) {
      LOCK();
      ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_78.ptr = args;
    if ((local_78.size != 0) && ((args->d).size != 0)) {
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)&this->m_connections,(this->m_connections).d.size,args
                );
      QList<QString>::end(&this->m_connections);
      if ((ulong)local_78.size < 2) {
        local_98.d.d = (Data *)0x0;
        local_98.d.ptr = (char16_t *)0x0;
        local_98.d.size = 0;
      }
      else {
        local_98.d.d = local_78.ptr[1].d.d;
        local_98.d.ptr = local_78.ptr[1].d.ptr;
        local_98.d.size = local_78.ptr[1].d.size;
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_98.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_98.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      if (local_98.d.size != 0) {
        pQVar9 = QMap<QString,_QList<QString>_>::operator[](&this->m_cursors,args);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)pQVar9,(pQVar9->d).size,&local_98);
        QList<QString>::end(pQVar9);
        if ((ulong)local_78.size < 3) {
          local_b8.d.d = (Data *)0x0;
          local_b8.d.ptr = (char16_t *)0x0;
          local_b8.d.size = 0;
        }
        else {
          local_b8.d.d = local_78.ptr[2].d.d;
          local_b8.d.ptr = local_78.ptr[2].d.ptr;
          local_b8.d.size = local_78.ptr[2].d.size;
          if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&((local_b8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((local_b8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        qVar4 = local_b8.d.size;
        if (local_b8.d.size != 0) {
          pQVar9 = QMap<QString,_QList<QString>_>::operator[](&this->m_fields,args);
          QList<QString>::append(pQVar9,&local_b8);
        }
        if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
          }
        }
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
        if (qVar4 == 0) goto LAB_00141125;
        goto LAB_00141116;
      }
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  }
LAB_00141125:
  QHash<QString,_DomProperty_*>::~QHash(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DatabaseInfo::acceptWidget(DomWidget *node)
{
    QHash<QString, DomProperty*> properties = propertyMap(node->elementProperty());

    DomProperty *frameworkCode = properties.value("frameworkCode"_L1);
    if (frameworkCode && !toBool(frameworkCode->elementBool()))
        return;

    DomProperty *db = properties.value("database"_L1);
    if (db && db->elementStringList()) {
        QStringList info = db->elementStringList()->elementString();
        if (info.isEmpty() || info.constFirst().isEmpty())
            return;
        const QString &connection = info.constFirst();
        m_connections.append(connection);

        QString table = info.size() > 1 ? info.at(1) : QString();
        if (table.isEmpty())
            return;
        m_cursors[connection].append(table);

        QString field = info.size() > 2 ? info.at(2) : QString();
        if (field.isEmpty())
            return;
        m_fields[connection].append(field);
    }

    TreeWalker::acceptWidget(node);
}